

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLookupResultValid
               (TextureCubeArrayView *texture,Sampler *sampler,LookupPrecision *prec,
               IVec4 *coordBits,Vec4 *coord,Vec2 *lodBounds,Vec4 *result)

{
  CubeFace face;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FilterMode FVar6;
  long lVar7;
  int layerNdx;
  int layerNdx_00;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int numPossibleFaces;
  int local_2b8;
  CubeFaceFloatCoords faceCoords;
  Vec2 local_290;
  undefined1 local_288 [16];
  long local_270;
  Vec3 layerCoord;
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces [6];
  ConstPixelBufferAccess faces1 [6];
  
  if (texture->m_numLevels < 1) {
    iVar8 = -1;
  }
  else {
    iVar8 = (texture->m_levels->m_size).m_data[2] / 6 + -1;
  }
  fVar12 = coord->m_data[3];
  local_288._0_4_ = TexVerifierUtil::computeFloatingPointError(fVar12,coordBits->m_data[3]);
  fVar11 = floorf((fVar12 - (float)local_288._0_4_) + 0.5);
  iVar10 = (int)fVar11;
  fVar12 = ceilf(fVar12 + (float)local_288._0_4_ + 0.5);
  iVar4 = (int)fVar12 + -1;
  layerNdx_00 = iVar8;
  if (iVar10 < iVar8) {
    layerNdx_00 = iVar10;
  }
  if (iVar10 < 0) {
    layerNdx_00 = 0;
  }
  if (iVar4 < iVar8) {
    iVar8 = iVar4;
  }
  if (iVar4 < 0) {
    iVar8 = 0;
  }
  layerCoord.m_data[2] = coord->m_data[2];
  layerCoord.m_data._0_8_ = *(undefined8 *)coord->m_data;
  numPossibleFaces = 0;
  TexVerifierUtil::getPossibleCubeFaces
            (&layerCoord,&prec->coordBits,possibleFaces,&numPossibleFaces);
  if (numPossibleFaces == 0) {
    bVar3 = true;
  }
  else {
    bVar3 = layerNdx_00 <= iVar8;
    local_2b8 = iVar8;
    if (layerNdx_00 <= iVar8) {
      do {
        if (0 < numPossibleFaces) {
          local_270 = 0;
          do {
            face = possibleFaces[local_270];
            projectToFace((tcu *)faces,face,&layerCoord);
            faceCoords.s = (float)faces[0].m_format.order;
            faceCoords.t = (float)faces[0].m_format.type;
            fVar12 = lodBounds->m_data[0];
            fVar11 = lodBounds->m_data[1];
            fVar13 = sampler->lodThreshold;
            faceCoords.face = face;
            if (fVar12 <= fVar13) {
              lVar7 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar7 + -8));
                lVar7 = lVar7 + 0x28;
              } while (lVar7 != 0xf0);
              getCubeArrayLevelFaces(texture,0,layerNdx_00,&faces);
              bVar1 = isCubeLevelSampleResultValid
                                (&faces,sampler,sampler->magFilter,prec,&faceCoords,result);
              if (bVar1) {
                return bVar3;
              }
            }
            if (fVar13 < fVar11) {
              FVar6 = sampler->minFilter;
              iVar8 = texture->m_numLevels;
              iVar4 = iVar8 + -1;
              if (iVar4 < 1 || (FVar6 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
                if ((FVar6 == LINEAR_MIPMAP_NEAREST) || (FVar6 == NEAREST_MIPMAP_NEAREST)) {
                  fVar12 = ceilf(fVar12 + 0.5);
                  iVar10 = (int)fVar12 + -1;
                  iVar8 = iVar4;
                  if (iVar10 < iVar4) {
                    iVar8 = iVar10;
                  }
                  iVar9 = 0;
                  if (iVar10 < 0) {
                    iVar8 = 0;
                  }
                  fVar12 = floorf(fVar11 + 0.5);
                  iVar10 = (int)fVar12;
                  if (iVar10 < iVar4) {
                    iVar4 = iVar10;
                  }
                  if (iVar10 < 0) {
                    iVar4 = iVar9;
                  }
                  bVar1 = iVar4 < iVar8;
                  if (iVar8 <= iVar4) {
                    do {
                      lVar7 = 0;
                      do {
                        ConstPixelBufferAccess::ConstPixelBufferAccess
                                  ((ConstPixelBufferAccess *)
                                   ((long)faces[0].m_size.m_data + lVar7 + -8));
                        lVar7 = lVar7 + 0x28;
                      } while (lVar7 != 0xf0);
                      getCubeArrayLevelFaces(texture,iVar8,layerNdx_00,&faces);
                      uVar5 = sampler->minFilter - LINEAR;
                      FVar6 = NEAREST;
                      if (uVar5 < 5) {
                        FVar6 = *(FilterMode *)(&DAT_00bc26d8 + (ulong)uVar5 * 4);
                      }
                      bVar2 = isCubeLevelSampleResultValid
                                        (&faces,sampler,FVar6,prec,&faceCoords,result);
                      if (bVar2) {
                        iVar9 = 1;
                        goto LAB_00abc9c8;
                      }
                      iVar8 = iVar8 + 1;
                      bVar1 = iVar4 < iVar8;
                    } while (iVar8 <= iVar4);
                    iVar9 = 0;
                  }
LAB_00abc9c8:
                  if (bVar1) goto LAB_00abc927;
                }
                else {
                  lVar7 = 0;
                  do {
                    ConstPixelBufferAccess::ConstPixelBufferAccess
                              ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar7 + -8)
                              );
                    lVar7 = lVar7 + 0x28;
                  } while (lVar7 != 0xf0);
                  getCubeArrayLevelFaces(texture,0,layerNdx_00,&faces);
                  bVar1 = isCubeLevelSampleResultValid
                                    (&faces,sampler,sampler->minFilter,prec,&faceCoords,result);
                  iVar9 = 1;
                  if (!bVar1) {
LAB_00abc927:
                    iVar9 = 0;
                  }
                }
              }
              else {
                fVar13 = floorf(fVar12);
                iVar10 = (int)fVar13;
                iVar8 = iVar8 + -2;
                iVar4 = iVar8;
                if (iVar10 < iVar8) {
                  iVar4 = iVar10;
                }
                if (iVar10 < 0) {
                  iVar4 = 0;
                }
                fVar13 = floorf(fVar11);
                iVar10 = (int)fVar13;
                if (iVar10 < iVar8) {
                  iVar8 = iVar10;
                }
                if (iVar10 < 0) {
                  iVar8 = 0;
                }
                do {
                  iVar10 = iVar4;
                  if (iVar8 < iVar10) {
                    iVar9 = 0;
                    goto LAB_00abc91d;
                  }
                  fVar15 = fVar12 - (float)iVar10;
                  fVar13 = 1.0;
                  if (fVar15 <= 1.0) {
                    fVar13 = fVar15;
                  }
                  fVar16 = fVar11 - (float)iVar10;
                  local_288 = ZEXT416((uint)fVar16);
                  fVar14 = 1.0;
                  if (fVar16 <= 1.0) {
                    fVar14 = fVar16;
                  }
                  lVar7 = 0;
                  do {
                    ConstPixelBufferAccess::ConstPixelBufferAccess
                              ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar7 + -8)
                              );
                    lVar7 = lVar7 + 0x28;
                  } while (lVar7 != 0xf0);
                  lVar7 = 0;
                  do {
                    ConstPixelBufferAccess::ConstPixelBufferAccess
                              ((ConstPixelBufferAccess *)
                               ((long)faces1[0].m_size.m_data + lVar7 + -8));
                    lVar7 = lVar7 + 0x28;
                  } while (lVar7 != 0xf0);
                  getCubeArrayLevelFaces(texture,iVar10,layerNdx_00,&faces);
                  getCubeArrayLevelFaces(texture,iVar10 + 1,layerNdx_00,&faces1);
                  uVar5 = sampler->minFilter - LINEAR;
                  FVar6 = NEAREST;
                  if (uVar5 < 5) {
                    FVar6 = *(FilterMode *)(&DAT_00bc26d8 + (ulong)uVar5 * 4);
                  }
                  local_290.m_data[0] = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar13);
                  local_290.m_data[1] =
                       (float)(~-(uint)((float)local_288._0_4_ < 0.0) & (uint)fVar14);
                  bVar1 = isCubeMipmapLinearSampleResultValid
                                    (&faces,&faces1,sampler,FVar6,prec,&faceCoords,&local_290,result
                                    );
                  iVar4 = iVar10 + 1;
                } while (!bVar1);
                iVar9 = 1;
LAB_00abc91d:
                if (iVar8 < iVar10) goto LAB_00abc927;
              }
              if (iVar9 != 0) {
                return bVar3;
              }
            }
            local_270 = local_270 + 1;
          } while (local_270 < numPossibleFaces);
        }
        layerNdx_00 = layerNdx_00 + 1;
        bVar3 = layerNdx_00 <= local_2b8;
      } while (layerNdx_00 <= local_2b8);
    }
  }
  return bVar3;
}

Assistant:

bool isLookupResultValid (const TextureCubeArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const IVec4& coordBits, const Vec4& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2	layerRange						= computeLayerRange(texture.getNumLayers(), coordBits.w(), coord.w());
	const Vec3	layerCoord						= coord.toWidth<3>();
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(layerCoord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int layerNdx = layerRange.x(); layerNdx <= layerRange.y(); layerNdx++)
	{
		for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
		{
			const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], layerCoord));
			const float					minLod			= lodBounds.x();
			const float					maxLod			= lodBounds.y();
			const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
			const bool					canBeMinified	= maxLod > sampler.lodThreshold;

			if (canBeMagnified)
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
					return true;
			}

			if (canBeMinified)
			{
				const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
				const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
				const int	minTexLevel		= 0;
				const int	maxTexLevel		= texture.getNumLevels()-1;

				DE_ASSERT(minTexLevel <= maxTexLevel);

				if (isLinearMipmap && minTexLevel < maxTexLevel)
				{
					const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						const float		minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
						const float		maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

						ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
						ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

						getCubeArrayLevelFaces(texture, levelNdx,		layerNdx,	faces0);
						getCubeArrayLevelFaces(texture, levelNdx + 1,	layerNdx,	faces1);

						if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
							return true;
					}
				}
				else if (isNearestMipmap)
				{
					// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
					//		 decision to allow floor(lod + 0.5) as well.
					const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						ConstPixelBufferAccess faces[CUBEFACE_LAST];
						getCubeArrayLevelFaces(texture, levelNdx, layerNdx, faces);

						if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
							return true;
					}
				}
				else
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
						return true;
				}
			}
		}
	}

	return false;
}